

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::CBString::reversefind(CBString *this,char c,int pos)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = (this->super_tagbstring).slen;
  uVar2 = 0xffffffff;
  if (pos <= iVar1) {
    for (uVar3 = pos - (uint)(iVar1 == pos);
        (uVar2 = 0xffffffff, -1 < (int)uVar3 &&
        (uVar2 = uVar3, (this->super_tagbstring).data[uVar3] != c)); uVar3 = uVar3 - 1) {
    }
  }
  return uVar2;
}

Assistant:

int CBString::reversefind (char c, int pos) const {
	if (pos > slen) return BSTR_ERR;
	if (pos == slen) pos--;
	for (;pos >= 0; pos--) {
		if (data[pos] == (unsigned char) c) return pos;
	}
	return BSTR_ERR;
}